

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O3

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndArray(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,SizeType memberCount)

{
  byte bVar1;
  char *pcVar2;
  size_t count;
  
  pcVar2 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  if ((ulong)((long)pcVar2 -
             (long)(this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).level_stack_.stack_) < 0x10) {
    __assert_fail("Base::level_stack_.GetSize() >= sizeof(typename Base::Level)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/prettywriter.h"
                  ,0x99,
                  "bool rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndArray(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  if (pcVar2[-8] != '\0') {
    (this->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).level_stack_.stackTop_ = pcVar2 + -0x10;
    if ((*(long *)(pcVar2 + -0x10) != 0) &&
       ((this->formatOptions_ & kFormatSingleLineArray) == kFormatDefault)) {
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                         (&((this->
                            super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            ).os_)->stack_,1);
      *pcVar2 = '\n';
      count = (ulong)this->indentCharCount_ *
              ((ulong)((long)(this->
                             super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                             ).level_stack_.stackTop_ -
                      (long)(this->
                            super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            ).level_stack_.stack_) >> 4);
      bVar1 = (this->
              super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              ).field_0x3d;
      pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                         (&((this->
                            super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            ).os_)->stack_,count);
      memset(pcVar2,(uint)bVar1,count);
    }
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>
                       (&((this->
                          super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                          ).os_)->stack_,1);
    *pcVar2 = ']';
    return true;
  }
  __assert_fail("Base::level_stack_.template Top<typename Base::Level>()->inArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/prettywriter.h"
                ,0x9a,
                "bool rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndArray(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
               );
}

Assistant:

bool String(const Ch* str) { return String(str, internal::StrLen(str)); }